

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPluginAPI.cxx
# Opt level: O1

int cmExecuteCommand(void *arg,char *name,int numArgs,char **args)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  ulong uVar3;
  cmExecutionStatus status;
  cmListFileFunction lff;
  allocator local_c9;
  long *local_c8;
  long local_c0;
  long local_b8 [2];
  cmMakefile *local_a8;
  cmListFileArgument local_a0;
  cmListFileFunction local_70;
  
  local_70.super_cmCommandContext.Name._M_dataplus._M_p =
       (pointer)&local_70.super_cmCommandContext.Name.field_2;
  local_70.super_cmCommandContext.Name._M_string_length = 0;
  local_70.super_cmCommandContext.Name.field_2._M_local_buf[0] = '\0';
  local_70.super_cmCommandContext.Line = 0;
  local_70.Arguments.super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_70.Arguments.super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_70.Arguments.super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_a8 = (cmMakefile *)arg;
  strlen(name);
  std::__cxx11::string::_M_replace((ulong)&local_70,0,(char *)0x0,(ulong)name);
  if (0 < numArgs) {
    paVar1 = &local_a0.Value.field_2;
    uVar3 = 0;
    do {
      std::__cxx11::string::string((string *)&local_c8,args[uVar3],&local_c9);
      local_a0.Value._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_a0,local_c8,local_c0 + (long)local_c8);
      local_a0.Delim = Quoted;
      local_a0.Line = 0;
      std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>::
      emplace_back<cmListFileArgument>(&local_70.Arguments,&local_a0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a0.Value._M_dataplus._M_p != paVar1) {
        operator_delete(local_a0.Value._M_dataplus._M_p,
                        local_a0.Value.field_2._M_allocated_capacity + 1);
      }
      if (local_c8 != local_b8) {
        operator_delete(local_c8,local_b8[0] + 1);
      }
      uVar3 = uVar3 + 1;
    } while ((uint)numArgs != uVar3);
  }
  local_a0.Value._M_dataplus._M_p = local_a0.Value._M_dataplus._M_p & 0xffffffff00000000;
  bVar2 = cmMakefile::ExecuteCommand(local_a8,&local_70,(cmExecutionStatus *)&local_a0);
  std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>::~vector(&local_70.Arguments)
  ;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70.super_cmCommandContext.Name._M_dataplus._M_p !=
      &local_70.super_cmCommandContext.Name.field_2) {
    operator_delete(local_70.super_cmCommandContext.Name._M_dataplus._M_p,
                    CONCAT71(local_70.super_cmCommandContext.Name.field_2._M_allocated_capacity.
                             _1_7_,local_70.super_cmCommandContext.Name.field_2._M_local_buf[0]) + 1
                   );
  }
  return (int)bVar2;
}

Assistant:

int CCONV cmExecuteCommand(void* arg, const char* name, int numArgs,
                           const char** args)
{
  cmMakefile* mf = static_cast<cmMakefile*>(arg);
  cmListFileFunction lff;
  lff.Name = name;
  for (int i = 0; i < numArgs; ++i) {
    // Assume all arguments are quoted.
    lff.Arguments.push_back(
      cmListFileArgument(args[i], cmListFileArgument::Quoted, 0));
  }
  cmExecutionStatus status;
  return mf->ExecuteCommand(lff, status);
}